

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

uint64 mkvmuxer::EbmlElementSize(uint64 type,char *value)

{
  int32 iVar1;
  int32 iVar2;
  size_t sVar3;
  size_t value_00;
  uint64 ebml_size;
  char *value_local;
  uint64 type_local;
  
  if (value == (char *)0x0) {
    type_local = 0;
  }
  else {
    iVar1 = GetUIntSize(type);
    sVar3 = strlen(value);
    value_00 = strlen(value);
    iVar2 = GetCodedUIntSize(value_00);
    type_local = (long)iVar2 + sVar3 + (long)iVar1;
  }
  return type_local;
}

Assistant:

uint64 EbmlElementSize(uint64 type, const char* value) {
  if (!value)
    return 0;

  // Size of EBML ID
  uint64 ebml_size = GetUIntSize(type);

  // Datasize
  ebml_size += strlen(value);

  // Size of Datasize
  ebml_size += GetCodedUIntSize(strlen(value));

  return ebml_size;
}